

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__set
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  StackMemoryManager *this_00;
  URI *this_01;
  xmlChar **ppxVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  uint *puVar5;
  StringHash SVar6;
  void *pvVar7;
  ParserChar *text;
  bool failed;
  ParserChar *attributeValue;
  bool local_131;
  ParserChar *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  uint *local_120;
  URI local_118;
  
  this_00 = &(this->
             super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             ).super_ParserTemplateBase.mStackMemoryManager;
  puVar5 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x130);
  uVar3 = set__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar5 = set__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar5 + 2) = uVar3;
  uVar3 = set__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar5 + 4) = set__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar5 + 6) = uVar3;
  uVar3 = set__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar5 + 8) = set__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar5 + 10) = uVar3;
  *(undefined8 *)(puVar5 + 0xc) = set__AttributeData::DEFAULT._48_8_;
  this_01 = (URI *)(puVar5 + 0xe);
  COLLADABU::URI::URI(this_01,(URI *)(set__AttributeData::DEFAULT + 0x38),false);
  uVar3 = set__AttributeData::DEFAULT._296_8_;
  *(undefined8 *)(puVar5 + 0x48) = set__AttributeData::DEFAULT._288_8_;
  *(undefined8 *)(puVar5 + 0x4a) = uVar3;
  *attributeDataPtr = puVar5;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (ParserChar *)0x0)) {
    local_120 = puVar5 + 0x48;
    local_128 = (XSList<GeneratedSaxParser::ParserString> *)(puVar5 + 4);
    do {
      SVar6 = GeneratedSaxParser::Utils::calculateStringHash(text);
      local_130 = ppxVar1[1];
      if ((long)SVar6 < 0x7f8b6) {
        if (SVar6 == 0x6f4) {
          *(ParserChar **)(puVar5 + 0xc) = local_130;
        }
        else if (SVar6 == 0x6f8b6) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_130,&local_131);
          COLLADABU::URI::operator=(this_01,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_131 == true) &&
             (bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x79c4,0x6f8b6,local_130), bVar4)) {
            return false;
          }
          if ((local_131 & 1U) == 0) {
            *(byte *)puVar5 = (byte)*puVar5 | 2;
          }
        }
        else if (SVar6 == 0x7c065) {
          *(ParserChar **)(puVar5 + 2) = local_130;
        }
        else {
LAB_0073c0a2:
          if (*(long *)local_120 == 0) {
            pvVar7 = GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
          }
          else {
            pvVar7 = GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
          }
          *(void **)(puVar5 + 0x48) = pvVar7;
          lVar2 = *(long *)(puVar5 + 0x4a);
          *(ParserChar **)((long)pvVar7 + lVar2 * 8) = text;
          *(ParserChar **)(*(long *)(puVar5 + 0x48) + 8 + lVar2 * 8) = local_130;
          *(long *)(puVar5 + 0x4a) = lVar2 + 2;
        }
      }
      else if (SVar6 == 0x7f8b6) {
        *(ParserChar **)(puVar5 + 10) = local_130;
      }
      else if (SVar6 == 0x6a28a3) {
        bVar4 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::
                characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,local_130,local_128);
        if (bVar4) {
          *(byte *)puVar5 = (byte)*puVar5 | 1;
        }
        else {
          bVar4 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x79c4,0x6a28a3,local_130);
          if (bVar4) {
            return false;
          }
        }
      }
      else {
        if (SVar6 != 0x7ac025) goto LAB_0073c0a2;
        *(ParserChar **)(puVar5 + 8) = local_130;
      }
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (ParserChar *)0x0);
  }
  if ((*puVar5 & 1) == 0) {
    puVar5[4] = 0;
    puVar5[5] = 0;
    puVar5[6] = 0;
    puVar5[7] = 0;
  }
  if ((*puVar5 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_01,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__set( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__set( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

set__AttributeData* attributeData = newData<set__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_TYPE:
    {

attributeData->type = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_SET, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SET,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_SET,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= set__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_SET,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= set__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & set__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & set__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}